

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanSyncObjectManager.cpp
# Opt level: O2

VulkanRecycledFence * __thiscall
VulkanUtilities::VulkanSyncObjectManager::CreateFence
          (VulkanRecycledFence *__return_storage_ptr__,VulkanSyncObjectManager *this)

{
  mutex *__mutex;
  pointer ppVVar1;
  NativeType SyncObj;
  VkFence vkFence;
  VkFenceCreateInfo FenceCI;
  shared_ptr<VulkanUtilities::VulkanSyncObjectManager> local_60;
  __shared_ptr<VulkanUtilities::VulkanSyncObjectManager,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  VkFence local_40;
  VkFenceCreateInfo local_38;
  
  __mutex = &this->m_FencePoolGuard;
  std::mutex::lock(__mutex);
  ppVVar1 = (this->m_FencePool).super__Vector_base<VkFence_T_*,_std::allocator<VkFence_T_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if ((this->m_FencePool).super__Vector_base<VkFence_T_*,_std::allocator<VkFence_T_*>_>._M_impl.
      super__Vector_impl_data._M_start == ppVVar1) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    local_38.pNext = (void *)0x0;
    local_38.flags = 0;
    local_38._20_4_ = 0;
    local_40 = (NativeType)0x0;
    local_38.sType = VK_STRUCTURE_TYPE_FENCE_CREATE_INFO;
    local_38._4_4_ = 0;
    (*vkCreateFence)(this->m_LogicalDevice->m_VkDevice,&local_38,(VkAllocationCallbacks *)0x0,
                     &local_40);
    std::__shared_ptr<VulkanUtilities::VulkanSyncObjectManager,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<VulkanUtilities::VulkanSyncObjectManager,void>
              (local_50,(__weak_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>
                         *)this);
    RecycledSyncObject<VulkanUtilities::VkFenceType>::RecycledSyncObject
              (__return_storage_ptr__,
               (shared_ptr<VulkanUtilities::VulkanSyncObjectManager> *)local_50,local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  }
  else {
    SyncObj = ppVVar1[-1];
    (this->m_FencePool).super__Vector_base<VkFence_T_*,_std::allocator<VkFence_T_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVVar1 + -1;
    std::__shared_ptr<VulkanUtilities::VulkanSyncObjectManager,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<VulkanUtilities::VulkanSyncObjectManager,void>
              ((__shared_ptr<VulkanUtilities::VulkanSyncObjectManager,(__gnu_cxx::_Lock_policy)2> *)
               &local_60,
               (__weak_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2> *)
               this);
    RecycledSyncObject<VulkanUtilities::VkFenceType>::RecycledSyncObject
              (__return_storage_ptr__,&local_60,SyncObj);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_60.
                super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return __return_storage_ptr__;
}

Assistant:

VulkanRecycledFence VulkanSyncObjectManager::CreateFence()
{
    {
        std::lock_guard<std::mutex> Lock{m_FencePoolGuard};

        if (!m_FencePool.empty())
        {
            auto vkFence = m_FencePool.back();
            m_FencePool.pop_back();
            return {shared_from_this(), vkFence};
        }
    }

    VkFenceCreateInfo FenceCI = {};
    VkFence           vkFence = VK_NULL_HANDLE;

    FenceCI.sType = VK_STRUCTURE_TYPE_FENCE_CREATE_INFO;
    vkCreateFence(m_LogicalDevice.GetVkDevice(), &FenceCI, nullptr, &vkFence);

    return {shared_from_this(), vkFence};
}